

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int mriStep_Init(void *arkode_mem,int init_type)

{
  long *liw;
  long *lrw;
  size_t __nmemb;
  MRIStepCoupling pMVar1;
  ARKodeMRIStepMem pAVar2;
  int iVar3;
  int *piVar4;
  realtype *prVar5;
  N_Vector *pp_Var6;
  int error_code;
  ARKodeMem ark_mem_00;
  char *msgfmt;
  long lVar7;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  ARKodeMem local_40;
  ARKodeMRIStepMem local_38;
  
  iVar3 = mriStep_AccessStepMem(arkode_mem,"mriStep_Init",&local_40,&local_38);
  pAVar2 = local_38;
  ark_mem_00 = local_40;
  if (iVar3 != 0) {
    return iVar3;
  }
  if (init_type == 1) {
    return 0;
  }
  if (init_type != 0) {
LAB_004f4ba0:
    ark_mem_00 = local_40;
    if ((local_38->linit == (ARKLinsolInitFn)0x0) ||
       (iVar3 = (*local_38->linit)(local_40), iVar3 == 0)) {
      ark_mem_00 = local_40;
      if ((local_38->NLS == (SUNNonlinearSolver)0x0) ||
         (iVar3 = mriStep_NlsInit(local_40), iVar3 == 0)) {
        local_40->call_fullrhs = 1;
        return 0;
      }
      msgfmt = "Unable to initialize SUNNonlinearSolver object";
      iVar3 = -0x1d;
      error_code = -0x1d;
    }
    else {
      msgfmt = "The linear solver\'s init routine failed.";
      iVar3 = -5;
      error_code = -5;
    }
    goto LAB_004f4c20;
  }
  if (local_38->implicit_rhs == 0 && local_40->user_efun == 0) {
    local_40->user_efun = 0;
    local_40->efun = arkEwtSetSmallReal;
    local_40->e_data = local_40;
  }
  if (local_40->fixedstep == 0) {
    msgfmt = "Adaptive outer time stepping is not currently supported";
  }
  else {
    iVar3 = mriStep_SetCoupling(local_40);
    if (iVar3 == 0) {
      iVar3 = mriStep_CheckCoupling(ark_mem_00);
      if (iVar3 == 0) {
        pMVar1 = pAVar2->MRIC;
        piVar4 = pAVar2->stage_map;
        pAVar2->stages = pMVar1->stages;
        iVar3 = pMVar1->p;
        pAVar2->q = pMVar1->q;
        pAVar2->p = iVar3;
        if (piVar4 != (int *)0x0) {
          free(piVar4);
          pAVar2->stage_map = (int *)0x0;
          ark_mem_00->liw = ark_mem_00->liw - (long)pAVar2->stages;
        }
        iVar3 = pAVar2->stages;
        piVar4 = (int *)calloc((long)iVar3,4);
        pAVar2->stage_map = piVar4;
        ark_mem_00->liw = ark_mem_00->liw + (long)iVar3;
        iVar3 = mriStepCoupling_GetStageMap(pAVar2->MRIC,piVar4,&pAVar2->nstages_stored);
        if (iVar3 == 0) {
          liw = &ark_mem_00->liw;
          if (pAVar2->stagetypes != (int *)0x0) {
            free(pAVar2->stagetypes);
            pAVar2->stagetypes = (int *)0x0;
            *liw = *liw - (long)pAVar2->stages;
          }
          iVar3 = pAVar2->stages;
          piVar4 = (int *)calloc((long)iVar3,4);
          pAVar2->stagetypes = piVar4;
          *liw = *liw + (long)iVar3;
          if (0 < pAVar2->stages) {
            lVar7 = 0;
            do {
              iVar3 = mriStepCoupling_GetStageType(pAVar2->MRIC,(int)lVar7);
              pAVar2->stagetypes[lVar7] = iVar3;
              lVar7 = lVar7 + 1;
            } while (lVar7 < pAVar2->stages);
          }
          if (pAVar2->Ae_row != (realtype *)0x0) {
            free(pAVar2->Ae_row);
            pAVar2->Ae_row = (realtype *)0x0;
            ark_mem_00->lrw = ark_mem_00->lrw - (long)pAVar2->stages;
          }
          iVar3 = pAVar2->stages;
          prVar5 = (realtype *)calloc((long)iVar3,8);
          pAVar2->Ae_row = prVar5;
          ark_mem_00->lrw = ark_mem_00->lrw + (long)iVar3;
          lrw = &ark_mem_00->lrw;
          if (pAVar2->Ai_row != (realtype *)0x0) {
            free(pAVar2->Ai_row);
            pAVar2->Ai_row = (realtype *)0x0;
            *lrw = *lrw - (long)pAVar2->stages;
          }
          iVar3 = pAVar2->stages;
          prVar5 = (realtype *)calloc((long)iVar3,8);
          pAVar2->Ai_row = prVar5;
          *lrw = *lrw + (long)iVar3;
          if (((pAVar2->explicit_rhs != 0) &&
              (iVar3 = arkAllocVecArray(pAVar2->nstages_stored,ark_mem_00->ewt,&pAVar2->Fse,
                                        ark_mem_00->lrw1,lrw,ark_mem_00->liw1,liw), iVar3 == 0)) ||
             ((pAVar2->implicit_rhs != 0 &&
              (iVar3 = arkAllocVecArray(pAVar2->nstages_stored,ark_mem_00->ewt,&pAVar2->Fsi,
                                        ark_mem_00->lrw1,lrw,ark_mem_00->liw1,liw), iVar3 == 0)))) {
            return -0x14;
          }
          if (pAVar2->implicit_rhs == 0) {
            if ((pAVar2->NLS != (SUNNonlinearSolver)0x0) && (pAVar2->ownNLS != 0)) {
              SUNNonlinSolFree(pAVar2->NLS);
              pAVar2->NLS = (SUNNonlinearSolver)0x0;
              pAVar2->ownNLS = 0;
            }
            pAVar2->lsolve = (ARKLinsolSolveFn)0x0;
            pAVar2->lfree = (ARKLinsolFreeFn)0x0;
            pAVar2->linit = (ARKLinsolInitFn)0x0;
            pAVar2->lsetup = (ARKLinsolSetupFn)0x0;
            pAVar2->lmem = (void *)0x0;
          }
          else {
            iVar3 = arkAllocVec(ark_mem_00,ark_mem_00->ewt,&pAVar2->sdata);
            if (iVar3 == 0) {
              return -0x14;
            }
            iVar3 = arkAllocVec(ark_mem_00,ark_mem_00->ewt,&pAVar2->zpred);
            if (iVar3 == 0) {
              return -0x14;
            }
            iVar3 = arkAllocVec(ark_mem_00,ark_mem_00->ewt,&pAVar2->zcor);
            if (iVar3 == 0) {
              return -0x14;
            }
          }
          __nmemb = (long)pAVar2->stages * 2 + 2;
          iVar3 = (int)__nmemb;
          pAVar2->nfusedopvecs = iVar3;
          if (pAVar2->cvals == (realtype *)0x0) {
            prVar5 = (realtype *)calloc(__nmemb,8);
            pAVar2->cvals = prVar5;
            if (prVar5 == (realtype *)0x0) {
              return -0x14;
            }
            *lrw = *lrw + __nmemb;
          }
          if (pAVar2->Xvecs == (N_Vector *)0x0) {
            pp_Var6 = (N_Vector *)calloc((long)iVar3,8);
            pAVar2->Xvecs = pp_Var6;
            if (pp_Var6 == (N_Vector *)0x0) {
              return -0x14;
            }
            *liw = *liw + (long)iVar3;
          }
          iVar3 = mriStepInnerStepper_AllocVecs(pAVar2->stepper,pAVar2->MRIC->nmat,ark_mem_00->ewt);
          if (iVar3 != 0) {
            arkProcessError(ark_mem_00,-0x16,"ARKode::MRIStep","mriStep_Init",
                            "Error allocating inner stepper memory");
            return -0x14;
          }
          if ((ark_mem_00->interp == (ARKInterp)0x0) ||
             (iVar3 = arkInterpSetDegree(ark_mem_00,ark_mem_00->interp,1 - pAVar2->q), iVar3 == 0))
          goto LAB_004f4ba0;
          msgfmt = "Unable to update interpolation polynomial degree";
          goto LAB_004f4879;
        }
      }
      msgfmt = "Error in coupling table";
    }
    else {
      msgfmt = "Could not create coupling table";
    }
  }
LAB_004f4879:
  iVar3 = -0x16;
  error_code = -0x16;
LAB_004f4c20:
  arkProcessError(ark_mem_00,error_code,"ARKode::MRIStep","mriStep_Init",msgfmt);
  return iVar3;
}

Assistant:

int mriStep_Init(void* arkode_mem, int init_type)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval, j;
  booleantype reset_efun;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_Init",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* immediately return if reset */
  if (init_type == RESET_INIT) return(ARK_SUCCESS);

  /* initializations/checks for (re-)initialization call */
  if (init_type == FIRST_INIT) {

    /* enforce use of arkEwtSmallReal if using a fixed step size for
       an explicit method and an internal error weight function */
    reset_efun = SUNTRUE;
    if ( step_mem->implicit_rhs )  reset_efun = SUNFALSE;
    if ( ark_mem->user_efun )  reset_efun = SUNFALSE;
    if (reset_efun) {
      ark_mem->user_efun = SUNFALSE;
      ark_mem->efun      = arkEwtSetSmallReal;
      ark_mem->e_data    = ark_mem;
    }

    /* assume fixed outer step size */
    if (!ark_mem->fixedstep) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                      "Adaptive outer time stepping is not currently supported");
      return(ARK_ILL_INPUT);
    }

    /* Create coupling structure (if not already set) */
    retval = mriStep_SetCoupling(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                      "Could not create coupling table");
      return(ARK_ILL_INPUT);
    }

    /* Check that coupling structure is OK */
    retval = mriStep_CheckCoupling(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                      "mriStep_Init", "Error in coupling table");
      return(ARK_ILL_INPUT);
    }

    /* Retrieve/store method and embedding orders now that tables are finalized */
    step_mem->stages = step_mem->MRIC->stages;
    step_mem->q = step_mem->MRIC->q;
    step_mem->p = step_mem->MRIC->p;

    /* allocate/fill derived quantities from MRIC structure */

    /* stage map */
    if (step_mem->stage_map) {
      free(step_mem->stage_map);
      step_mem->stage_map = NULL;
      ark_mem->liw -= step_mem->stages;
    }
    step_mem->stage_map = (int *) calloc(step_mem->stages, sizeof(int));
    ark_mem->liw += step_mem->stages;

    retval = mriStepCoupling_GetStageMap(step_mem->MRIC,
                                         step_mem->stage_map,
                                         &(step_mem->nstages_stored));
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                      "mriStep_Init", "Error in coupling table");
      return(ARK_ILL_INPUT);
    }

    /* stage types */
    if (step_mem->stagetypes) {
      free(step_mem->stagetypes);
      step_mem->stagetypes = NULL;
      ark_mem->liw -= step_mem->stages;
    }
    step_mem->stagetypes = (int *) calloc(step_mem->stages, sizeof(int));
    ark_mem->liw += step_mem->stages;
    for (j=0; j<step_mem->stages; j++)
      step_mem->stagetypes[j] = mriStepCoupling_GetStageType(step_mem->MRIC, j);

    /* explicit RK coefficient row */
    if (step_mem->Ae_row) {
      free(step_mem->Ae_row);
      step_mem->Ae_row = NULL;
      ark_mem->lrw -= step_mem->stages;
    }
    step_mem->Ae_row = (realtype *) calloc(step_mem->stages,
                                           sizeof(realtype));
    ark_mem->lrw += step_mem->stages;

    /* implicit RK coefficient row */
    if (step_mem->Ai_row) {
      free(step_mem->Ai_row);
      step_mem->Ai_row = NULL;
      ark_mem->lrw -= step_mem->stages;
    }
    step_mem->Ai_row = (realtype *) calloc(step_mem->stages,
                                           sizeof(realtype));
    ark_mem->lrw += step_mem->stages;

    /* Allocate MRI RHS vector memory, update storage requirements */
    /*   Allocate Fse[0] ... Fse[nstages_stored - 1] if needed */
    if (step_mem->explicit_rhs) {
      if (!arkAllocVecArray(step_mem->nstages_stored,
                            ark_mem->ewt, &(step_mem->Fse),
                            ark_mem->lrw1, &(ark_mem->lrw),
                            ark_mem->liw1, &(ark_mem->liw)))
        return(ARK_MEM_FAIL);
    }

    /*   Allocate Fsi[0] ... Fsi[nstages_stored - 1] if needed */
    if (step_mem->implicit_rhs) {
      if (!arkAllocVecArray(step_mem->nstages_stored,
                            ark_mem->ewt, &(step_mem->Fsi),
                            ark_mem->lrw1, &(ark_mem->lrw),
                            ark_mem->liw1, &(ark_mem->liw)))
        return(ARK_MEM_FAIL);
    }

    /* if any slow stage is implicit, allocate sdata, zpred, zcor vectors;
       if all stages explicit, free default NLS object, and detach all
       linear solver routines.  Note: step_mem->implicit_rhs will only equal
       SUNTRUE if an implicit table has been user-provided. */
    if (step_mem->implicit_rhs) {
      if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->sdata)))
        return(ARK_MEM_FAIL);
      if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->zpred)))
        return(ARK_MEM_FAIL);
      if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->zcor)))
        return(ARK_MEM_FAIL);
    } else {
      if ((step_mem->NLS != NULL) && (step_mem->ownNLS)) {
        SUNNonlinSolFree(step_mem->NLS);
        step_mem->NLS = NULL;
        step_mem->ownNLS = SUNFALSE;
      }
      step_mem->linit  = NULL;
      step_mem->lsetup = NULL;
      step_mem->lsolve = NULL;
      step_mem->lfree  = NULL;
      step_mem->lmem   = NULL;
    }

    /* Allocate reusable arrays for fused vector interface */
    step_mem->nfusedopvecs = 2*step_mem->stages + 2;
    if (step_mem->cvals == NULL) {
      step_mem->cvals = (realtype *) calloc(step_mem->nfusedopvecs, sizeof(realtype));
      if (step_mem->cvals == NULL)  return(ARK_MEM_FAIL);
      ark_mem->lrw += (step_mem->nfusedopvecs);
    }
    if (step_mem->Xvecs == NULL) {
      step_mem->Xvecs = (N_Vector *) calloc(step_mem->nfusedopvecs, sizeof(N_Vector));
      if (step_mem->Xvecs == NULL)  return(ARK_MEM_FAIL);
      ark_mem->liw += (step_mem->nfusedopvecs);   /* pointers */
    }

    /* Allocate inner stepper data */
    retval = mriStepInnerStepper_AllocVecs(step_mem->stepper,
                                           step_mem->MRIC->nmat, ark_mem->ewt);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                      "Error allocating inner stepper memory");
      return(ARK_MEM_FAIL);
    }

    /* Limit interpolant degree based on method order (use negative
       argument to specify update instead of overwrite) */
    if (ark_mem->interp != NULL) {
      retval = arkInterpSetDegree(ark_mem, ark_mem->interp, -(step_mem->q-1));
      if (retval != ARK_SUCCESS) {
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                        "Unable to update interpolation polynomial degree");
        return(ARK_ILL_INPUT);
      }
    }

  }

  /* Call linit (if it exists) */
  if (step_mem->linit) {
    retval = step_mem->linit(ark_mem);
    if (retval != 0) {
      arkProcessError(ark_mem, ARK_LINIT_FAIL, "ARKode::MRIStep", "mriStep_Init",
                      MSG_ARK_LINIT_FAIL);
      return(ARK_LINIT_FAIL);
    }
  }

  /* Initialize the nonlinear solver object (if it exists) */
  if (step_mem->NLS) {
    retval = mriStep_NlsInit(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_NLS_INIT_FAIL, "ARKode::MRIStep", "mriStep_Init",
                      "Unable to initialize SUNNonlinearSolver object");
      return(ARK_NLS_INIT_FAIL);
    }
  }

  /* Signal to shared arkode module that fullrhs is required after each step */
  ark_mem->call_fullrhs = SUNTRUE;

  return(ARK_SUCCESS);
}